

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_format.hpp
# Opt level: O0

void __thiscall csv::CSVFormat::CSVFormat(CSVFormat *this)

{
  initializer_list<char> __l;
  allocator_type local_22;
  char local_21;
  iterator local_20;
  size_type local_18;
  CSVFormat *local_10;
  CSVFormat *this_local;
  
  local_21 = ',';
  local_20 = &local_21;
  local_18 = 1;
  local_10 = this;
  std::allocator<char>::allocator();
  __l._M_len = local_18;
  __l._M_array = local_20;
  std::vector<char,_std::allocator<char>_>::vector(&this->possible_delimiters,__l,&local_22);
  std::allocator<char>::~allocator(&local_22);
  memset(&this->trim_chars,0,0x18);
  std::vector<char,_std::allocator<char>_>::vector(&this->trim_chars);
  this->header = 0;
  this->no_quote = false;
  this->quote_char = '\"';
  memset(&this->col_names,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->col_names);
  this->variable_column_policy = IGNORE_ROW;
  return;
}

Assistant:

CSVFormat() = default;